

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

void __thiscall axl::io::MappedFile::MappedFile(MappedFile *this)

{
  long in_RDI;
  size_t in_stack_ffffffffffffffe8;
  MappedViewMgr *in_stack_fffffffffffffff0;
  
  File::File((File *)0x16f540);
  MappedViewMgr::MappedViewMgr(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  MappedViewMgr::MappedViewMgr(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  *(undefined8 *)(in_RDI + 0x98) = 0x10000;
  *(undefined8 *)(in_RDI + 0xa0) = 0x20;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  return;
}

Assistant:

MappedFile::MappedFile():
	m_dynamicViewMgr(offsetof(MappedFile, m_dynamicViewMgr)),
	m_permanentViewMgr(offsetof(MappedFile, m_permanentViewMgr)) {
	m_readAheadSize = DefaultsKind_ReadAheadSize;
	m_maxDynamicViewCount = DefaultsKind_MaxDynamicViewCount;
	m_fileFlags = 0;

#if (_AXL_OS_WIN)
	m_mappingSize = 0;
#endif
}